

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O0

MatrixXd * lf::io::anon_unknown_1::AuxNodesTria(MatrixXd *__return_storage_ptr__,uchar order)

{
  uint uVar1;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar2;
  Scalar *pSVar3;
  EvalReturnType other;
  Index IVar4;
  Type local_998;
  ConstantReturnType local_960;
  double local_948;
  double local_940;
  Matrix<double,2,1,0,2,1> local_938 [16];
  Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_928;
  double local_908;
  MatrixXd local_900;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_8e8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_8c0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
  local_870;
  undefined1 local_7f0 [8];
  MatrixXd points;
  ConstantReturnType local_7a0;
  double local_788;
  double local_780;
  Matrix<double,2,1,0,2,1> local_778 [24];
  Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_760;
  double local_740;
  DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>_>
  local_738 [32];
  NegativeReturnType local_718;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_6e8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_698;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_628;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
  local_5b0;
  Type local_508;
  ConstantReturnType local_4d0;
  double local_4b8;
  double local_4b0;
  Matrix<double,2,1,0,2,1> local_4a8 [16];
  Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_498;
  double local_478;
  int local_470 [2];
  Matrix<double,2,1,0,2,1> local_468 [16];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_458;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_438;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_3f8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
  local_3b0;
  Type local_338;
  ConstantReturnType local_300;
  double local_2e8;
  double local_2e0;
  Matrix<double,2,1,0,2,1> local_2d8 [24];
  Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_2c0;
  double local_2a0;
  MatrixBase<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>>
  local_298 [32];
  Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_278;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>
  local_250;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>
  local_200;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
  local_188;
  MatrixXd local_e0;
  undefined1 local_c8 [8];
  Matrix<double,__1,__1,_0,__1,__1> segment_points;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_80;
  Scalar local_60 [3];
  Scalar local_48;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_40;
  RefElType local_1d;
  uint local_1c [2];
  undefined1 local_12;
  byte local_11;
  MatrixXd *pMStack_10;
  uchar order_local;
  MatrixXd *result;
  
  local_11 = order;
  pMStack_10 = __return_storage_ptr__;
  if (order < 3) {
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(__return_storage_ptr__);
  }
  else {
    local_12 = 0;
    local_1c[1] = 2;
    local_1d = (RefElType)lf::base::RefEl::kTria();
    local_1c[0] = NumAuxNodes((RefEl)local_1d,local_11);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
              ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)(local_1c + 1),local_1c
              );
    if (local_11 == 3) {
      local_48 = 0.3333333333333333;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
                (&local_40,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
                 &local_48);
      local_60[0] = 0.3333333333333333;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (&local_40,local_60);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                (&local_40);
    }
    else if (local_11 == 4) {
      local_88 = 0.25;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
                (&local_80,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
                 &local_88);
      local_90 = 0.5;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (&local_80,&local_90);
      local_98 = 0.25;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar2,&local_98);
      local_a0 = 0.25;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar2,&local_a0);
      local_a8 = 0.25;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar2,&local_a8);
      segment_points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = 0x3fe0000000000000;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar2,(Scalar *)
                        &segment_points.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                (&local_80);
    }
    else {
      uVar1 = (uint)local_11;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,0,0);
      *pSVar3 = 1.0 / (double)uVar1;
      uVar1 = (uint)local_11;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,1,0);
      *pSVar3 = 1.0 / (double)uVar1;
      uVar1 = (uint)local_11;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,0,1);
      *pSVar3 = ((double)uVar1 + -2.0) / (double)uVar1;
      uVar1 = (uint)local_11;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,1,1);
      *pSVar3 = 1.0 / (double)uVar1;
      uVar1 = (uint)local_11;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,0,2);
      *pSVar3 = 1.0 / (double)uVar1;
      uVar1 = (uint)local_11;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,1,2);
      *pSVar3 = ((double)uVar1 + -2.0) / (double)uVar1;
      if (4 < local_11) {
        AuxNodesSegment(&local_e0,local_11 - 3);
        other = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eval
                          ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_e0);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_c8,other);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_e0);
        Eigen::MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::UnitX();
        Eigen::
        MatrixBase<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>>
        ::operator*(&local_278,local_298,
                    (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_c8);
        local_2a0 = (double)local_11 + -3.0;
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
        ::operator*(&local_250,
                    (MatrixBase<Eigen::Product<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                     *)&local_278,&local_2a0);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,-1,0,2,-1>const>const>>
        ::operator/(&local_200,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,_1,0,2,_1>const>const>>
                     *)&local_250,&local_11);
        local_2e0 = 1.0 / (double)local_11;
        local_2e8 = 1.0 / (double)local_11;
        Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>(local_2d8,&local_2e0,&local_2e8);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Ones
                  (&local_300,1,(long)(int)(local_11 - 4));
        Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
                  (&local_2c0,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_2d8,
                   (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_300);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,-1,0,2,-1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,-1,0,2,-1>const>const>>
        ::operator+(&local_188,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,_1,0,2,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,_1,0,2,_1>const>const>>
                     *)&local_200,
                    (MatrixBase<Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                     *)&local_2c0);
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                  (&local_338,
                   (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,0,3,2,
                   local_11 - 4);
        Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_338,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>_>
                    *)&local_188);
        local_470[1] = 0xffffffff;
        local_470[0] = 1;
        Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_468,local_470 + 1,local_470);
        local_478 = (double)local_11 + -3.0;
        Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
                  (&local_458,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_468,&local_478);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
        ::operator/(&local_438,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
                     *)&local_458,&local_11);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
        ::operator*(&local_3f8,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
                     *)&local_438,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_c8)
        ;
        local_4b0 = ((double)local_11 + -2.0) / (double)local_11;
        local_4b8 = 1.0 / (double)local_11;
        Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>(local_4a8,&local_4b0,&local_4b8);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Ones
                  (&local_4d0,1,(long)(int)(local_11 - 4));
        Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
                  (&local_498,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_4a8,
                   (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_4d0);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
        ::operator+(&local_3b0,
                    (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                     *)&local_3f8,
                    (MatrixBase<Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                     *)&local_498);
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                  (&local_508,
                   (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,0,
                   (ulong)(uint)local_11 - 1,2,local_11 - 4);
        Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_508,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>_>
                    *)&local_3b0);
        Eigen::MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::UnitY();
        Eigen::
        DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>_>
        ::operator-(&local_718,local_738);
        local_740 = (double)local_11 + -3.0;
        Eigen::
        MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>const>>
        ::operator*(&local_6e8,
                    (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>const>>
                     *)&local_718,&local_740);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
        ::operator/(&local_698,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
                     *)&local_6e8,&local_11);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
        ::operator*(&local_628,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
                     *)&local_698,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_c8)
        ;
        local_780 = 1.0 / (double)local_11;
        local_788 = ((double)local_11 + -2.0) / (double)local_11;
        Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>(local_778,&local_780,&local_788);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Ones
                  (&local_7a0,1,(long)(int)(local_11 - 4));
        Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
                  (&local_760,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_778,
                   (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_7a0);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
        ::operator+(&local_5b0,
                    (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                     *)&local_628,
                    (MatrixBase<Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                     *)&local_760);
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                  ((Type *)&points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols,
                   (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,0,
                   (long)(int)((local_11 - 5) + (uint)local_11),2,local_11 - 4);
        Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)
                   &points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>_>
                    *)&local_5b0);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_c8);
      }
      if (5 < local_11) {
        AuxNodesTria((MatrixXd *)local_7f0,local_11 - 3);
        AuxNodesTria(&local_900,local_11 - 3);
        local_908 = (double)local_11 + -6.0;
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                  (&local_8e8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_900,
                   &local_908);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>
        ::operator/(&local_8c0,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                     *)&local_8e8,&local_11);
        local_940 = 2.0 / (double)local_11;
        local_948 = 2.0 / (double)local_11;
        Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>(local_938,&local_940,&local_948);
        IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_7f0);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Ones(&local_960,1,IVar4);
        Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
                  (&local_928,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_938,
                   (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_960);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>
        ::operator+(&local_870,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                     *)&local_8c0,
                    (MatrixBase<Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                     *)&local_928);
        uVar1 = (uint)local_11;
        IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_7f0);
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,long>
                  (&local_998,
                   (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,0,
                   (long)(int)(uVar1 * 3 + -9),2,IVar4);
        Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_998,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>_>
                    *)&local_870);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_900);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_7f0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd AuxNodesTria(unsigned char order) {
  if (order < 3) {
    return {};
  }
  Eigen::MatrixXd result(2, NumAuxNodes(base::RefEl::kTria(), order));
  if (order == 3) {
    result << 1. / 3., 1. / 3.;
  } else if (order == 4) {
    result << 0.25, 0.5, 0.25, 0.25, 0.25, 0.5;
  } else {
    // assign nodes:
    result(0, 0) = 1. / order;
    result(1, 0) = 1. / order;
    result(0, 1) = (order - 2.) / order;
    result(1, 1) = 1. / order;
    result(0, 2) = 1. / order;
    result(1, 2) = (order - 2.) / order;

    if (order > 4) {
      auto segment_points = AuxNodesSegment(order - 3).eval();
      // assign edges:
      result.block(0, 3, 2, order - 4) =
          Eigen::Vector2d::UnitX() * segment_points * (order - 3.) / order +
          Eigen::Vector2d(1. / order, 1. / order) *
              Eigen::MatrixXd::Ones(1, order - 4);
      result.block(0, order - 1, 2, order - 4) =
          Eigen::Vector2d(-1, 1) * (order - 3.) / order * segment_points +
          Eigen::Vector2d((order - 2.) / order, 1. / order) *
              Eigen::MatrixXd::Ones(1, order - 4);
      result.block(0, 2 * order - 5, 2, order - 4) =
          -Eigen::Vector2d::UnitY() * (order - 3.) / order * segment_points +
          Eigen::Vector2d(1. / order, (order - 2.) / order) *
              Eigen::MatrixXd::Ones(1, order - 4);
    }
    if (order > 5) {
      // assign interior points recursively:
      auto points = AuxNodesTria(order - 3);
      result.block(0, 3 * order - 9, 2, points.cols()) =
          AuxNodesTria(order - 3) * (order - 6.) / order +
          Eigen::Vector2d(2. / order, 2. / order) *
              Eigen::MatrixXd::Ones(1, points.cols());
    }
  }
  return result;
}